

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URITest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::URI_testPrint_Test::~URI_testPrint_Test(URI_testPrint_Test *this)

{
  URI_testPrint_Test *this_local;
  
  ~URI_testPrint_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(URI, testPrint)
{
    std::ostringstream oss;
    oss << URI::parse("localhost");
    ASSERT_EQ(
        "{ scheme=\"\""
        ", host=\"\""
        ", port=0"
        ", path=\"localhost\""
        ", query=\"\" }",
        oss.str());
}